

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  allocator local_51;
  string local_50;
  string local_30;
  
  if (argc < 3) {
    std::operator<<((ostream *)&std::cout,"Please Input the dataset path:");
    std::operator>>((istream *)&std::cin,(string *)&FILE_NAME_abi_cxx11_);
    std::operator<<((ostream *)&std::cout,"Please Input the length of record in dtaset:");
    std::istream::operator>>((istream *)&std::cin,&record_length);
  }
  else {
    std::__cxx11::string::assign((char *)&FILE_NAME_abi_cxx11_);
    std::__cxx11::string::string((string *)&local_50,argv[2],&local_51);
    record_length = std::__cxx11::stoi(&local_50,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_50);
  }
  printf(
        "\x1b[0m\x1b[1;32m|                                  2. Test on Elastic                                   |\n\x1b[0m"
        );
  printf(
        "\x1b[0m\x1b[1;32m===========================================================================================\n\x1b[0m"
        );
  std::__cxx11::string::string((string *)&local_30,(string *)&FILE_NAME_abi_cxx11_);
  BenchElastic<4u>(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  printf(
        "\x1b[0m\x1b[1;32m===========================================================================================\n\x1b[0m"
        );
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	if (argc > 2)
	{
		FILE_NAME = argv[1];
		record_length = std::stoi(argv[2]);
	}
	else
	{
		std::cout << "Please Input the dataset path:";
		std::cin >> FILE_NAME;
		std::cout << "Please Input the length of record in dtaset:";
		std::cin >> record_length;
	}
		printf(
			"\033[0m\033[1;32m|                                  2. Test on "
			"Elastic                                   |\n\033[0m");
		printf(
			"\033[0m\033[1;32m======================================================="
			"====================================\n\033[0m");
		BenchElastic<4>(FILE_NAME);
		printf(
			"\033[0m\033[1;32m======================================================="
			"====================================\n\033[0m");
}